

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall QFutureInterfaceBase::setProgressValue(QFutureInterfaceBase *this,int progressValue)

{
  long in_FS_OFFSET;
  QFutureInterfaceBase *unaff_retaddr;
  QString *in_stack_fffffffffffffff0;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)0x6debb0);
  setProgressValueAndText(unaff_retaddr,(int)((ulong)lVar1 >> 0x20),in_stack_fffffffffffffff0);
  QString::~QString((QString *)0x6debcf);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::setProgressValue(int progressValue)
{
    setProgressValueAndText(progressValue, QString());
}